

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O0

void UpdateChroma(fixed_y_t *src1,fixed_y_t *src2,fixed_t *dst,int uv_w,int rgb_bit_depth,
                 SharpYuvTransferFunctionType transfer_type)

{
  short sVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  int in_ECX;
  short *in_RDX;
  undefined4 in_R8D;
  int in_R9D;
  int W;
  int b;
  int g;
  int r;
  int i;
  SharpYuvTransferFunctionType transfer_type_00;
  short *local_18;
  
  transfer_type_00 = 0;
  local_18 = in_RDX;
  do {
    uVar2 = ScaleDown((uint16_t)((uint)in_ECX >> 0x10),(uint16_t)in_ECX,
                      (uint16_t)((uint)in_R8D >> 0x10),(uint16_t)in_R8D,in_R9D,transfer_type_00);
    uVar3 = ScaleDown((uint16_t)((uint)in_ECX >> 0x10),(uint16_t)in_ECX,
                      (uint16_t)((uint)in_R8D >> 0x10),(uint16_t)in_R8D,in_R9D,transfer_type_00);
    uVar4 = ScaleDown((uint16_t)((uint)in_ECX >> 0x10),(uint16_t)in_ECX,
                      (uint16_t)((uint)in_R8D >> 0x10),(uint16_t)in_R8D,in_R9D,transfer_type_00);
    iVar5 = RGBToGray((long)(int)uVar2,(long)(int)uVar3,(long)(int)uVar4);
    sVar1 = (short)iVar5;
    *local_18 = (short)uVar2 - sVar1;
    local_18[in_ECX] = (short)uVar3 - sVar1;
    local_18[in_ECX << 1] = (short)uVar4 - sVar1;
    local_18 = local_18 + 1;
    transfer_type_00 = transfer_type_00 + kSharpYuvTransferFunctionBt709;
  } while ((int)transfer_type_00 < in_ECX);
  return;
}

Assistant:

static void UpdateChroma(const fixed_y_t* src1, const fixed_y_t* src2,
                         fixed_t* dst, int uv_w, int rgb_bit_depth,
                         SharpYuvTransferFunctionType transfer_type) {
  int i = 0;
  do {
    const int r =
        ScaleDown(src1[0 * uv_w + 0], src1[0 * uv_w + 1], src2[0 * uv_w + 0],
                  src2[0 * uv_w + 1], rgb_bit_depth, transfer_type);
    const int g =
        ScaleDown(src1[2 * uv_w + 0], src1[2 * uv_w + 1], src2[2 * uv_w + 0],
                  src2[2 * uv_w + 1], rgb_bit_depth, transfer_type);
    const int b =
        ScaleDown(src1[4 * uv_w + 0], src1[4 * uv_w + 1], src2[4 * uv_w + 0],
                  src2[4 * uv_w + 1], rgb_bit_depth, transfer_type);
    const int W = RGBToGray(r, g, b);
    dst[0 * uv_w] = (fixed_t)(r - W);
    dst[1 * uv_w] = (fixed_t)(g - W);
    dst[2 * uv_w] = (fixed_t)(b - W);
    dst  += 1;
    src1 += 2;
    src2 += 2;
  } while (++i < uv_w);
}